

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509cset.cc
# Opt level: O3

int X509_CRL_set1_lastUpdate(X509_CRL *x,ASN1_TIME *tm)

{
  if (x != (X509_CRL *)0x0) {
    if (x->crl->lastUpdate != tm) {
      tm = (ASN1_TIME *)ASN1_STRING_dup((ASN1_STRING *)tm);
      if (tm == (ASN1_TIME *)0x0) {
        tm = (ASN1_TIME *)0x0;
      }
      else {
        ASN1_TIME_free((ASN1_TIME *)x->crl->lastUpdate);
        x->crl->lastUpdate = tm;
      }
    }
    return (int)(tm != (ASN1_TIME *)0x0);
  }
  return 0;
}

Assistant:

int X509_CRL_set1_lastUpdate(X509_CRL *x, const ASN1_TIME *tm) {
  ASN1_TIME *in;

  if (x == NULL) {
    return 0;
  }
  in = x->crl->lastUpdate;
  if (in != tm) {
    in = ASN1_STRING_dup(tm);
    if (in != NULL) {
      ASN1_TIME_free(x->crl->lastUpdate);
      x->crl->lastUpdate = in;
    }
  }
  return in != NULL;
}